

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmdblookup.c
# Opt level: O2

MMDB_lookup_result_s *
lookup_or_die(MMDB_lookup_result_s *__return_storage_ptr__,MMDB_s *mmdb,char *ipstr)

{
  int __status;
  FILE *__stream;
  char *pcVar1;
  int mmdb_error;
  int gai_error;
  
  MMDB_lookup_string(__return_storage_ptr__,mmdb,ipstr,&gai_error,&mmdb_error);
  __stream = _stderr;
  if (gai_error == 0) {
    if (mmdb_error == 0) {
      return __return_storage_ptr__;
    }
    pcVar1 = MMDB_strerror(mmdb_error);
    fprintf(__stream,"\n  Got an error from the maxminddb library: %s\n\n",pcVar1);
    __status = 4;
  }
  else {
    pcVar1 = gai_strerror(gai_error);
    fprintf(_stderr,"\n  Error from call to getaddrinfo for %s - %s\n\n",ipstr,pcVar1);
    __status = 3;
  }
  exit(__status);
}

Assistant:

static MMDB_lookup_result_s lookup_or_die(MMDB_s *mmdb, const char *ipstr) {
    int gai_error, mmdb_error;
    MMDB_lookup_result_s result =
        MMDB_lookup_string(mmdb, ipstr, &gai_error, &mmdb_error);

    if (0 != gai_error) {
#ifdef _WIN32
        char const *const strerr = gai_strerrorA(gai_error);
#else
        char const *const strerr = gai_strerror(gai_error);
#endif
        fprintf(stderr,
                "\n  Error from call to getaddrinfo for %s - %s\n\n",
                ipstr,
                strerr);
        exit(3);
    }

    if (MMDB_SUCCESS != mmdb_error) {
        fprintf(stderr,
                "\n  Got an error from the maxminddb library: %s\n\n",
                MMDB_strerror(mmdb_error));
        exit(4);
    }

    return result;
}